

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_header.c
# Opt level: O3

char * sam_hdr_find_line(SAM_hdr *hdr,char *type,char *ID_key,char *ID_value)

{
  char *__dest;
  SAM_hdr_tag *pSVar1;
  byte bVar2;
  int iVar3;
  SAM_hdr_type *pSVar4;
  char *pcVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  char *pcVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  bool bVar13;
  char *local_48;
  
  pSVar4 = sam_hdr_find(hdr,type,ID_key,ID_value);
  if (pSVar4 == (SAM_hdr_type *)0x0) {
    return (char *)0x0;
  }
  uVar11 = 1;
  pcVar5 = (char *)malloc(1);
  if (pcVar5 != (char *)0x0) {
    *pcVar5 = '@';
  }
  uVar10 = (ulong)(pcVar5 != (char *)0x0);
  sVar6 = strlen(type);
  iVar3 = (int)sVar6;
  uVar8 = (long)iVar3 + uVar10;
  uVar7 = uVar8 + 1;
  local_48 = pcVar5;
  if (uVar7 != 0) {
    uVar7 = uVar7 >> 1 | uVar7;
    uVar7 = uVar7 >> 2 | uVar7;
    uVar7 = uVar7 >> 4 | uVar7;
    uVar7 = uVar7 >> 8 | uVar7;
    uVar11 = (uVar7 >> 0x10 | uVar7) + 1;
    local_48 = (char *)realloc(pcVar5,uVar11);
    if (local_48 == (char *)0x0) {
      bVar12 = true;
      local_48 = pcVar5;
      goto LAB_00138bdd;
    }
  }
  memcpy(local_48 + uVar10,type,(long)iVar3);
  local_48[uVar8] = '\0';
  bVar12 = iVar3 == -1;
  uVar10 = uVar8;
LAB_00138bdd:
  bVar12 = (bool)(pcVar5 == (char *)0x0 | bVar12);
  pSVar1 = pSVar4->tag;
  do {
    if (pSVar1 == (SAM_hdr_tag *)0x0) {
      if (bVar12) {
        if (local_48 != (char *)0x0) {
          free(local_48);
        }
        return (char *)0x0;
      }
      return local_48;
    }
    pcVar5 = local_48;
    if (uVar11 < uVar10 + 1) {
      uVar11 = uVar10 >> 1 | uVar10;
      uVar11 = uVar11 >> 2 | uVar11;
      uVar11 = uVar11 >> 4 | uVar11;
      uVar11 = uVar11 >> 8 | uVar11;
      uVar11 = (uVar11 >> 0x10 | uVar11) + 1;
      pcVar5 = (char *)realloc(local_48,uVar11);
      if (pcVar5 != (char *)0x0) goto LAB_00138c66;
      bVar2 = 1;
    }
    else {
LAB_00138c66:
      pcVar5[uVar10] = '\t';
      bVar2 = 0;
      uVar10 = uVar10 + 1;
      local_48 = pcVar5;
    }
    pcVar5 = pSVar1->str;
    iVar3 = pSVar1->len;
    sVar6 = (size_t)iVar3;
    uVar8 = uVar10 + sVar6 + 1;
    pcVar9 = local_48;
    if (uVar8 < uVar11) {
LAB_00138cdf:
      __dest = pcVar9 + uVar10;
      uVar10 = uVar10 + sVar6;
      memcpy(__dest,pcVar5,sVar6);
      pcVar9[uVar10] = '\0';
      bVar13 = iVar3 == -1;
      local_48 = pcVar9;
    }
    else {
      uVar8 = uVar8 >> 1 | uVar8;
      uVar8 = uVar8 >> 2 | uVar8;
      uVar8 = uVar8 >> 4 | uVar8;
      uVar8 = uVar8 >> 8 | uVar8;
      uVar11 = (uVar8 >> 0x10 | uVar8) + 1;
      pcVar9 = (char *)realloc(local_48,uVar11);
      if (pcVar9 != (char *)0x0) goto LAB_00138cdf;
      bVar13 = true;
    }
    bVar12 = (bool)(bVar12 | bVar2 | bVar13);
    pSVar1 = pSVar1->next;
  } while( true );
}

Assistant:

char *sam_hdr_find_line(SAM_hdr *hdr, char *type,
			char *ID_key, char *ID_value) {
    SAM_hdr_type *ty = sam_hdr_find(hdr, type, ID_key, ID_value);
    kstring_t ks = KS_INITIALIZER;
    SAM_hdr_tag *tag;
    int r = 0;

    if (!ty)
	return NULL;

    // Paste together the line from the hashed copy
    r |= (kputc_('@', &ks) == EOF);
    r |= (kputs(type, &ks) == EOF);
    for (tag = ty->tag; tag; tag = tag->next) {
	r |= (kputc_('\t', &ks) == EOF);
	r |= (kputsn(tag->str, tag->len, &ks) == EOF);
    }

    if (r) {
	KS_FREE(&ks);
	return NULL;
    }

    return ks_str(&ks);
}